

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

void SingleTreeSearchHelper
               (ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,ON_RTreePairSearchResult *a_result)

{
  ON_RTreeBranch *a_rectB;
  int iVar1;
  bool bVar2;
  ON_2dex *pOVar3;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar4;
  ON_RTreeNode *pOVar5;
  
  iVar1 = a_nodeB->m_count;
  pOVar5 = a_nodeB;
  if (a_nodeB->m_level < 1) {
    while( true ) {
      paVar4 = &pOVar5->m_branch[0].field_1;
      a_rectB = pOVar5->m_branch;
      if (a_nodeB->m_branch + iVar1 <= a_rectB) break;
      pOVar5 = (ON_RTreeNode *)paVar4;
      if (a_branchA < a_rectB) {
        bVar2 = PairSearchOverlapHelper(&a_branchA->m_rect,&a_rectB->m_rect,a_result->m_tolerance);
        if (bVar2) {
          pOVar3 = ON_SimpleArray<ON_2dex>::AppendNew(a_result->m_result);
          pOVar3->i = *(int *)&a_branchA->field_1;
          pOVar3->j = *(int *)paVar4;
        }
      }
    }
  }
  else {
    while( true ) {
      paVar4 = &pOVar5->m_branch[0].field_1;
      if (a_nodeB->m_branch + iVar1 <= pOVar5->m_branch) break;
      bVar2 = PairSearchOverlapHelper
                        (&a_branchA->m_rect,&pOVar5->m_branch[0].m_rect,a_result->m_tolerance);
      pOVar5 = (ON_RTreeNode *)paVar4;
      if (bVar2) {
        SingleTreeSearchHelper(a_branchA,paVar4->m_child,a_result);
      }
    }
  }
  return;
}

Assistant:

static void SingleTreeSearchHelper(const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchResult* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;

  if (a_nodeB->m_level > 0)
  {
    // branchB's have children nodes and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
      {
        SingleTreeSearchHelper(a_branchA, branchB->m_child, a_result);
      }
      branchB++;
    }
  }
  else
  {
    // branchB's are leaves and a_branchA is a leaf
    while (branchB < branchBmax)
    {
      if (a_branchA < branchB)
      {
        if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
        {
          ON_2dex& r = a_result->m_result->AppendNew();
          r.i = (int)a_branchA->m_id;
          r.j = (int)branchB->m_id;
        }
      }
      branchB++;
    }
  }
}